

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O1

int av1_handle_inter_intra_mode
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MB_MODE_INFO *mbmi,
              HandleInterModeArgs *args,int64_t ref_best_rd,int *rate_mv,int *tmp_rate2,
              BUFFER_SET *orig_dst)

{
  _Bool _Var1;
  byte bVar2;
  uint8_t uVar3;
  _Bool _Var4;
  uint uVar5;
  bool bVar6;
  macroblockd_plane *pmVar7;
  undefined8 uVar8;
  uint8_t *puVar9;
  int64_t iVar10;
  long lVar11;
  int_mv iVar12;
  long lVar13;
  long lVar14;
  undefined7 in_register_00000011;
  int iVar15;
  int iVar16;
  BLOCK_SIZE bsize_00;
  int (*paiVar17) [4];
  RD_STATS *rd_stats;
  BUFFER_SET *pBVar18;
  uint dst_stride;
  uint uVar19;
  int64_t iVar20;
  MB_MODE_INFO *pMVar21;
  INTERINTRA_MODE cur_mode;
  buf_2d *pbVar22;
  ulong uVar23;
  int bw;
  uint8_t skip_txfm_sb_1;
  int tmp_rate_mv;
  AV1_COMMON *cm;
  int_mv tmp_mv;
  int rate;
  int64_t rd_thresh;
  int64_t dist;
  int64_t skip_sse_sb;
  uint8_t intrapred_ [2048];
  uint8_t tmp_buf_ [2048];
  int64_t *in_stack_ffffffffffffeed8;
  byte local_111d;
  undefined1 local_1105 [13];
  AV1_COMMON *local_10f8;
  long local_10f0;
  uint8_t *local_10e8;
  MB_MODE_INFO *local_10e0;
  int_mv local_10d8;
  int local_10d4;
  int (*local_10d0) [4];
  ulong local_10c8;
  AV1_COMP *local_10c0;
  int_mv local_10b4;
  uint8_t *local_10b0;
  long local_10a8;
  int (*local_10a0) [4];
  int local_1098;
  int local_1094;
  int64_t local_1090;
  ulong local_1088;
  uint8_t *local_1080;
  RD_STATS local_1078;
  HandleInterModeArgs *local_1050;
  uint8_t local_1048 [8];
  ulong local_1040;
  uint8_t local_1038 [2048];
  uint8_t local_838 [2056];
  
  local_10c8 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  local_10b4 = (int_mv)((int_mv *)
                       ((long)&av1_wedge_params_lookup[0].wedge_types +
                       (ulong)(uint)((int)CONCAT71(in_register_00000011,bsize) << 5)))->as_int;
  if (((int)local_10b4.as_int < 1) ||
     (x->source_variance <= (cpi->sf).inter_sf.disable_interintra_wedge_var_thresh)) {
    local_1088 = 0;
  }
  else {
    local_1088 = (ulong)CONCAT31((int3)(x->source_variance >> 8),
                                 (cpi->oxcf).comp_type_cfg.enable_interintra_wedge);
  }
  _Var1 = (cpi->oxcf).comp_type_cfg.enable_smooth_interintra;
  local_10f8 = &cpi->common;
  local_1105._5_8_ = &x->e_mbd;
  bVar2 = block_size_wide[local_10c8];
  uVar5 = ((x->e_mbd).cur_buf)->flags;
  local_1080 = (uint8_t *)((ulong)local_838 >> 1);
  if ((uVar5 & 8) == 0) {
    local_1080 = local_838;
  }
  local_10b0 = (uint8_t *)((ulong)local_1038 >> 1);
  local_1094 = (x->e_mbd).mi_row;
  local_1098 = (x->e_mbd).mi_col;
  mbmi->ref_frame[1] = -1;
  pmVar7 = (x->e_mbd).plane;
  (x->e_mbd).plane[0].dst.buf = local_1080;
  dst_stride = (uint)bVar2;
  (x->e_mbd).plane[0].dst.stride = dst_stride;
  rd_stats = (RD_STATS *)0x0;
  uVar19 = (uint)bsize;
  local_1090 = ref_best_rd;
  av1_enc_build_inter_predictor
            (local_10f8,(MACROBLOCKD *)local_1105._5_8_,local_1094,local_1098,(BUFFER_SET *)0x0,
             bsize,0,0);
  uVar3 = ((cpi->common).seq_params)->monochrome;
  local_1040 = (ulong)((uVar3 == '\0') + 1 + (uint)(uVar3 == '\0'));
  local_1078._32_8_ = *(undefined8 *)(orig_dst->stride + 2);
  local_1078.rdcost = (int64_t)orig_dst->plane[2];
  local_1078.sse = *(int64_t *)orig_dst->stride;
  local_1078._0_8_ = orig_dst->plane[0];
  local_1078.dist = (int64_t)orig_dst->plane[1];
  lVar13 = 6;
  do {
    pbVar22 = &pmVar7->dst;
    pbVar22->buf = (uint8_t *)(&local_10a8)[lVar13];
    pbVar22->stride = (&local_1078.rate)[lVar13];
    lVar11 = lVar13 - local_1040;
    lVar13 = lVar13 + 1;
    pmVar7 = (macroblockd_plane *)(pbVar22 + 0x51);
  } while (lVar11 != 5);
  puVar9 = local_10b0;
  if ((uVar5 & 8) == 0) {
    puVar9 = local_1038;
  }
  mbmi->ref_frame[1] = '\0';
  local_111d = args->inter_intra_mode[mbmi->ref_frame[0]];
  iVar20 = 0x7fffffff;
  bsize_00 = (BLOCK_SIZE)x;
  local_10e8 = puVar9;
  local_10e0 = mbmi;
  local_1050 = args;
  if (_Var1 == false) {
    lVar13 = 0x7fffffffffffffff;
    uVar23 = local_10c8;
  }
  else {
    bVar2 = ""[local_10c8];
    mbmi->field_0xa8 = mbmi->field_0xa8 & 0xfb;
    local_10a0 = (x->mode_costs).interintra_mode_cost + bVar2;
    if (((cpi->sf).inter_sf.reuse_inter_intra_mode == 0) || (local_111d == 4)) {
      lVar13 = 0;
      local_10f0 = 0x7fffffffffffffff;
      local_10c0 = cpi;
      do {
        uVar8 = local_1105._5_8_;
        if ((cpi->oxcf).intra_mode_cfg.enable_smooth_intra == true) {
          if ((lVar13 != 3) || ((cpi->sf).intra_sf.disable_smooth_intra == 0)) {
LAB_003b6fad:
            mbmi->interintra_mode = (INTERINTRA_MODE)lVar13;
            local_10d0 = (int (*) [4])(long)(*local_10a0)[lVar13];
            av1_build_intra_predictors_for_interintra
                      (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,puVar9,dst_stride
                      );
            av1_combine_interintra
                      ((MACROBLOCKD *)uVar8,bsize,0,local_1080,dst_stride,puVar9,dst_stride);
            mbmi = local_10e0;
            model_rd_for_sb_with_curvfit
                      ((AV1_COMP *)(ulong)uVar19,bsize_00,(MACROBLOCK *)uVar8,(MACROBLOCKD *)0x0,0,
                       (int)&local_10d4,&local_1078.rate,(int64_t *)&local_10d8.as_int,local_1048,
                       (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffeed8);
            lVar11 = local_1078._0_8_ * 0x80 +
                     ((long)x->rdmult * ((long)*local_10d0 + (long)local_10d4) + 0x100 >> 9);
            cpi = local_10c0;
            if (lVar11 < local_10f0) {
              local_111d = mbmi->interintra_mode;
              local_10f0 = lVar11;
            }
          }
        }
        else if (lVar13 != 3) goto LAB_003b6fad;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      local_1050->inter_intra_mode[mbmi->ref_frame[0]] = local_111d;
    }
    puVar9 = local_10e8;
    uVar8 = local_1105._5_8_;
    mbmi->interintra_mode = local_111d;
    iVar15 = 0;
    av1_build_intra_predictors_for_interintra
              (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,local_10e8,dst_stride);
    av1_combine_interintra((MACROBLOCKD *)uVar8,bsize,0,local_1080,dst_stride,puVar9,dst_stride);
    uVar23 = local_10c8;
    if (0 < (int)local_10b4.as_int) {
      iVar15 = (x->mode_costs).wedge_interintra_cost[local_10c8][0];
    }
    iVar20 = (long)iVar15 + (long)(*local_10a0)[local_111d];
    iVar15 = *rate_mv;
    lVar13 = 0x7fffffffffffffff;
    if (local_1090 < 0x47fffffffffffff7) {
      lVar13 = (local_1090 / 9) * 0x10;
    }
    rd_stats = &local_1078;
    iVar10 = estimate_yrd_for_sb(cpi,bsize,x,
                                 lVar13 - ((long)x->rdmult * (iVar15 + iVar20) + 0x100 >> 9),
                                 rd_stats);
    bVar6 = true;
    if (iVar10 == 0x7fffffffffffffff) {
      lVar13 = 0x7fffffffffffffff;
      iVar20 = 0x7fffffff;
    }
    else {
      lVar13 = local_1078.dist * 0x80 +
               ((long)x->rdmult * ((long)(int)(iVar15 + iVar20) + (long)local_1078.rate) + 0x100 >>
               9);
      if ((local_1090 == 0x7fffffffffffffff) || ((lVar13 >> 4) * 9 <= local_1090)) {
        bVar6 = false;
      }
    }
    if (bVar6) {
      return -1;
    }
  }
  pMVar21 = local_10e0;
  iVar12 = (int_mv)local_10e0->mv[0].as_int;
  local_1105._1_4_ = 0;
  iVar15 = 0;
  local_10d8 = iVar12;
  if ((byte)local_1088 == '\0') {
    lVar11 = 0x7fffffffffffffff;
  }
  else {
    bVar2 = ""[uVar23];
    _Var4 = (cpi->oxcf).comp_type_cfg.enable_smooth_interintra;
    *(ushort *)&local_10e0->field_0xa7 = *(ushort *)&local_10e0->field_0xa7 | 0x400;
    local_10d0 = (x->mode_costs).interintra_mode_cost + bVar2;
    local_10c0 = cpi;
    local_10b4 = iVar12;
    local_1090 = iVar20;
    if ((cpi->sf).inter_sf.fast_interintra_wedge_search == 0) {
      if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
        local_10b0 = local_1038;
      }
      local_10e0 = (MB_MODE_INFO *)0x0;
      local_10a0 = (int (*) [4])((ulong)local_10a0 & 0xffffffff00000000);
      lVar11 = 0x7fffffffffffffff;
      lVar14 = 0;
      local_10f0 = 0x7fffffffffffffff;
      local_10a8 = lVar13;
      do {
        pMVar21->interintra_mode = (INTERINTRA_MODE)lVar14;
        pBVar18 = orig_dst;
        av1_build_intra_predictors_for_interintra
                  (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,local_10b0,dst_stride
                  );
        iVar20 = pick_interintra_wedge
                           ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,
                            local_838,(uint8_t *)pBVar18);
        lVar13 = ((long)x->rdmult *
                  ((long)*(int *)((long)(x->mode_costs).wedge_idx_cost[0] +
                                 (long)pMVar21->interintra_wedge_index * 4 +
                                 (ulong)(uint)((int)uVar23 << 6)) + (long)(*local_10d0)[lVar14]) +
                  0x100 >> 9) + iVar20;
        if (lVar13 < lVar11) {
          local_10a0 = (int (*) [4])
                       CONCAT44(local_10a0._4_4_,(uint)(byte)pMVar21->interintra_wedge_index);
          local_10e0 = (MB_MODE_INFO *)(ulong)pMVar21->interintra_mode;
          lVar11 = lVar13;
          local_10f0 = iVar20;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      pMVar21->interintra_mode = (INTERINTRA_MODE)local_10e0;
      pMVar21->interintra_wedge_index = (int8_t)local_10a0;
      cpi = local_10c0;
      lVar11 = local_10f0;
      lVar13 = local_10a8;
      uVar23 = local_10c8;
      if ((int)local_10e0 != 3) {
        av1_build_intra_predictors_for_interintra
                  (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,local_10e8,dst_stride
                  );
        cpi = local_10c0;
        lVar11 = local_10f0;
        lVar13 = local_10a8;
        uVar23 = local_10c8;
      }
    }
    else if (_Var4 == false) {
      if (local_111d == 4) {
        local_10e0->interintra_mode = '\x03';
        lVar14 = 0;
        pBVar18 = orig_dst;
        local_10a8 = lVar13;
        av1_build_intra_predictors_for_interintra
                  (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,local_10e8,dst_stride
                  );
        lVar11 = pick_interintra_wedge
                           ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,
                            local_838,(uint8_t *)pBVar18);
        puVar9 = local_10e8;
        local_111d = 3;
        do {
          uVar8 = local_1105._5_8_;
          pMVar21->interintra_mode = (INTERINTRA_MODE)lVar14;
          iVar15 = (*local_10d0)[lVar14];
          local_10f0 = lVar11;
          av1_build_intra_predictors_for_interintra
                    (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,puVar9,dst_stride);
          av1_combine_interintra
                    ((MACROBLOCKD *)uVar8,bsize,0,local_1080,dst_stride,puVar9,dst_stride);
          pMVar21 = local_10e0;
          model_rd_for_sb_with_curvfit
                    ((AV1_COMP *)(ulong)uVar19,bsize_00,(MACROBLOCK *)uVar8,(MACROBLOCKD *)0x0,0,
                     (int)&local_10d4,&local_1078.rate,(int64_t *)local_1105,local_1048,
                     (int64_t *)0x0,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffeed8);
          lVar13 = local_1078._0_8_ * 0x80 +
                   ((long)x->rdmult * ((long)local_10d4 + (long)iVar15) + 0x100 >> 9);
          lVar11 = local_10f0;
          if (lVar13 < local_10f0) {
            local_111d = pMVar21->interintra_mode;
            lVar11 = lVar13;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        local_1050->inter_intra_mode[pMVar21->ref_frame[0]] = local_111d;
        pMVar21->interintra_mode = local_111d;
        cpi = local_10c0;
        lVar13 = local_10a8;
        uVar23 = local_10c8;
        if (local_111d != 3) {
          av1_build_intra_predictors_for_interintra
                    (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,local_10e8,
                     dst_stride);
          cpi = local_10c0;
          lVar13 = local_10a8;
          uVar23 = local_10c8;
        }
      }
      else {
        local_10e0->interintra_mode = local_111d;
        pBVar18 = orig_dst;
        av1_build_intra_predictors_for_interintra
                  (local_10f8,(MACROBLOCKD *)local_1105._5_8_,bsize,0,orig_dst,local_10e8,dst_stride
                  );
        lVar11 = pick_interintra_wedge
                           ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,
                            local_838,(uint8_t *)pBVar18);
      }
    }
    else {
      lVar11 = pick_interintra_wedge
                         ((AV1_COMP *)x,(MACROBLOCK *)(ulong)uVar19,(BLOCK_SIZE)local_1038,local_838
                          ,(uint8_t *)rd_stats);
    }
    local_10e0 = (MB_MODE_INFO *)
                 ((long)(x->mode_costs).wedge_interintra_cost[uVar23][1] +
                 (long)*(int *)((long)(x->mode_costs).wedge_idx_cost[0] +
                               (long)pMVar21->interintra_wedge_index * 4 +
                               (ulong)(uint)((int)uVar23 << 6)) +
                 (long)(*local_10d0)[pMVar21->interintra_mode]);
    local_10b0 = (uint8_t *)
                 (((long)x->rdmult * ((long)local_10e0->mv + (long)*rate_mv + -8) + 0x100 >> 9) +
                 lVar11);
    local_10f0 = CONCAT44(local_10f0._4_4_,pMVar21->mv[0].as_int);
    paiVar17 = (int (*) [4])(long)(int)local_10e0;
    lVar14 = 0x7fffffffffffffff;
    if ((pMVar21->mode < 0x19) &&
       (lVar14 = 0x7fffffffffffffff, (0x1790000U >> (pMVar21->mode & 0x1f) & 1) != 0)) {
      local_10d0 = paiVar17;
      av1_compound_single_motion_search
                (cpi,x,bsize,&local_10d8.as_mv,local_10e8,
                 *(uint8_t **)
                  (*(long *)((long)&av1_wedge_params_lookup[0].masks +
                            (ulong)(uint)((int)uVar23 << 5)) + 0x80 +
                  (long)pMVar21->interintra_wedge_index * 8),dst_stride,(int *)(local_1105 + 1),0);
      uVar8 = local_1105._5_8_;
      lVar14 = 0x7fffffffffffffff;
      paiVar17 = local_10d0;
      if (pMVar21->mv[0].as_int != local_10d8.as_int) {
        pMVar21->mv[0].as_int = (uint32_t)local_10d8;
        pMVar21->ref_frame[1] = -1;
        av1_enc_build_inter_predictor
                  (local_10f8,(MACROBLOCKD *)local_1105._5_8_,(x->e_mbd).mi_row,(x->e_mbd).mi_col,
                   orig_dst,bsize,0,0);
        pMVar21->ref_frame[1] = '\0';
        av1_combine_interintra
                  ((MACROBLOCKD *)uVar8,bsize,0,(x->e_mbd).plane[0].dst.buf,
                   (x->e_mbd).plane[0].dst.stride,local_10e8,dst_stride);
        cpi = local_10c0;
        model_rd_for_sb_with_curvfit
                  ((AV1_COMP *)(ulong)uVar19,bsize_00,(MACROBLOCK *)uVar8,(MACROBLOCKD *)0x0,0,
                   (int)&local_10d4,&local_1078.rate,(int64_t *)local_1105,local_1048,(int64_t *)0x0
                   ,(int *)0x0,(int64_t *)0x0,in_stack_ffffffffffffeed8);
        lVar14 = local_1078._0_8_ * 0x80 +
                 ((long)x->rdmult *
                  ((long)*local_10d0 + (long)local_10d4 + (long)(int)local_1105._1_4_) + 0x100 >> 9)
        ;
        paiVar17 = local_10d0;
      }
    }
    puVar9 = local_10b0;
    lVar11 = 0x7fffffffffffffff;
    if ((long)local_10b0 <= lVar14) {
      local_10d8.as_int = (uint32_t)local_10f0;
      local_1105._1_4_ = *rate_mv;
      av1_combine_interintra
                ((MACROBLOCKD *)local_1105._5_8_,bsize,0,local_1080,dst_stride,local_10e8,dst_stride
                );
    }
    iVar10 = estimate_yrd_for_sb(cpi,bsize,x,
                                 lVar13 - ((long)x->rdmult *
                                           ((long)*paiVar17 + (long)(int)local_1105._1_4_) + 0x100
                                          >> 9),&local_1078);
    if (iVar10 != 0x7fffffffffffffff) {
      lVar11 = local_1078.dist * 0x80 +
               ((long)x->rdmult *
                ((long)*paiVar17 + (long)local_1078.rate + (long)(int)local_1105._1_4_) + 0x100 >> 9
               );
    }
    iVar15 = (int)local_10e0;
    iVar20 = local_1090;
    iVar12 = local_10b4;
    if (iVar10 == 0x7fffffffffffffff && puVar9 == (uint8_t *)0x7fffffffffffffff) {
      return -1;
    }
  }
  if ((lVar13 != 0x7fffffffffffffff) || (iVar16 = -1, lVar11 != 0x7fffffffffffffff)) {
    if (lVar11 < lVar13) {
      pMVar21->mv[0] = local_10d8;
      *tmp_rate2 = *tmp_rate2 + (local_1105._1_4_ - *rate_mv);
      *rate_mv = local_1105._1_4_;
    }
    else {
      if ((_Var1 & (byte)local_1088) == 1) {
        pMVar21->field_0xa8 = pMVar21->field_0xa8 & 0xfb;
        pMVar21->interintra_mode = local_111d;
        pMVar21->mv[0] = iVar12;
        av1_enc_build_inter_predictor
                  (local_10f8,(MACROBLOCKD *)local_1105._5_8_,local_1094,local_1098,orig_dst,bsize,0
                   ,0);
      }
      iVar15 = (int)iVar20;
    }
    *tmp_rate2 = *tmp_rate2 + iVar15;
    iVar16 = 0;
    if (uVar3 == '\0') {
      av1_enc_build_inter_predictor
                (local_10f8,(MACROBLOCKD *)local_1105._5_8_,local_1094,local_1098,orig_dst,bsize,1,
                 (int)local_1040 + -1);
    }
  }
  return iVar16;
}

Assistant:

int av1_handle_inter_intra_mode(const AV1_COMP *const cpi, MACROBLOCK *const x,
                                BLOCK_SIZE bsize, MB_MODE_INFO *mbmi,
                                HandleInterModeArgs *args, int64_t ref_best_rd,
                                int *rate_mv, int *tmp_rate2,
                                const BUFFER_SET *orig_dst) {
  const int try_smooth_interintra =
      cpi->oxcf.comp_type_cfg.enable_smooth_interintra;

  const int is_wedge_used = av1_is_wedge_used(bsize);
  const int try_wedge_interintra =
      is_wedge_used && enable_wedge_interintra_search(x, cpi);

  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int bw = block_size_wide[bsize];
  DECLARE_ALIGNED(16, uint8_t, tmp_buf_[2 * MAX_INTERINTRA_SB_SQUARE]);
  DECLARE_ALIGNED(16, uint8_t, intrapred_[2 * MAX_INTERINTRA_SB_SQUARE]);
  uint8_t *tmp_buf = get_buf_by_bd(xd, tmp_buf_);
  uint8_t *intrapred = get_buf_by_bd(xd, intrapred_);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Single reference inter prediction
  mbmi->ref_frame[1] = NONE_FRAME;
  xd->plane[0].dst.buf = tmp_buf;
  xd->plane[0].dst.stride = bw;
  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);
  const int num_planes = av1_num_planes(cm);

  // Restore the buffers for intra prediction
  restore_dst_buf(xd, *orig_dst, num_planes);
  mbmi->ref_frame[1] = INTRA_FRAME;
  INTERINTRA_MODE best_interintra_mode =
      args->inter_intra_mode[mbmi->ref_frame[0]];

  // Compute smooth_interintra
  int64_t best_interintra_rd_nowedge = INT64_MAX;
  int best_mode_rate = INT_MAX;
  if (try_smooth_interintra) {
    int ret = handle_smooth_inter_intra_mode(
        cpi, x, bsize, mbmi, ref_best_rd, rate_mv, &best_interintra_mode,
        &best_interintra_rd_nowedge, &best_mode_rate, orig_dst, tmp_buf,
        intrapred, args);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  // Compute wedge interintra
  int64_t best_interintra_rd_wedge = INT64_MAX;
  const int_mv mv0 = mbmi->mv[0];
  int_mv tmp_mv = mv0;
  int tmp_rate_mv = 0;
  int rate_overhead = 0;
  if (try_wedge_interintra) {
    int ret = handle_wedge_inter_intra_mode(
        cpi, x, bsize, mbmi, rate_mv, &best_interintra_mode,
        &best_interintra_rd_wedge, orig_dst, tmp_buf_, tmp_buf, intrapred_,
        intrapred, args, &tmp_rate_mv, &rate_overhead, &tmp_mv,
        best_interintra_rd_nowedge);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  if (best_interintra_rd_nowedge == INT64_MAX &&
      best_interintra_rd_wedge == INT64_MAX) {
    return IGNORE_MODE;
  }
  if (best_interintra_rd_wedge < best_interintra_rd_nowedge) {
    mbmi->mv[0].as_int = tmp_mv.as_int;
    *tmp_rate2 += tmp_rate_mv - *rate_mv;
    *rate_mv = tmp_rate_mv;
    best_mode_rate = rate_overhead;
  } else if (try_smooth_interintra && try_wedge_interintra) {
    // If smooth was best, but we over-wrote the values when evaluating the
    // wedge mode, we need to recompute the smooth values.
    mbmi->use_wedge_interintra = 0;
    mbmi->interintra_mode = best_interintra_mode;
    mbmi->mv[0].as_int = mv0.as_int;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  *tmp_rate2 += best_mode_rate;

  if (num_planes > 1) {
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_U, num_planes - 1);
  }
  return 0;
}